

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_edit_focus(nk_context *ctx,nk_flags flags)

{
  nk_window *pnVar1;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x5b4f,"void nk_edit_focus(struct nk_context *, nk_flags)");
  }
  pnVar1 = ctx->current;
  if (pnVar1 != (nk_window *)0x0) {
    (pnVar1->edit).active = 1;
    (pnVar1->edit).name = (pnVar1->edit).seq;
    if ((flags >> 9 & 1) != 0) {
      (pnVar1->edit).mode = '\x01';
    }
    return;
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h",
                0x5b50,"void nk_edit_focus(struct nk_context *, nk_flags)");
}

Assistant:

NK_API void
nk_edit_focus(struct nk_context *ctx, nk_flags flags)
{
    nk_hash hash;
    struct nk_window *win;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    if (!ctx || !ctx->current) return;

    win = ctx->current;
    hash = win->edit.seq;
    win->edit.active = nk_true;
    win->edit.name = hash;
    if (flags & NK_EDIT_ALWAYS_INSERT_MODE)
        win->edit.mode = NK_TEXT_EDIT_MODE_INSERT;
}